

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

CURLcode tool_setopt_slist(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                          curl_slist *list)

{
  CURLcode CVar1;
  int i;
  uint local_1c;
  
  CVar1 = curl_easy_setopt(curl,tag,list);
  if ((CVar1 == CURLE_OK && list != (curl_slist *)0x0) && config->libcurl != (char *)0x0) {
    CVar1 = libcurl_generate_slist(list,(int *)&local_1c);
    if (CVar1 == CURLE_OK) {
      CVar1 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, slist%d);",name,(ulong)local_1c)
      ;
    }
  }
  return CVar1;
}

Assistant:

CURLcode tool_setopt_slist(CURL *curl, struct GlobalConfig *config,
                           const char *name, CURLoption tag,
                           struct curl_slist *list)
{
  CURLcode ret = CURLE_OK;

  ret = curl_easy_setopt(curl, tag, list);

  if(config->libcurl && list && !ret) {
    int i;

    ret = libcurl_generate_slist(list, &i);
    if(!ret)
      CODE2("curl_easy_setopt(hnd, %s, slist%d);", name, i);
  }

 nomem:
  return ret;
}